

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_TargetTypeEnforcementMultipleEdgesWithConstraintsInvalid_Test::
~CommandLineInterfaceTest_TargetTypeEnforcementMultipleEdgesWithConstraintsInvalid_Test
          (CommandLineInterfaceTest_TargetTypeEnforcementMultipleEdgesWithConstraintsInvalid_Test
           *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester((CommandLineInterfaceTester *)this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest,
       TargetTypeEnforcementMultipleEdgesWithConstraintsInvalid) {
  CreateTempFile("google/protobuf/descriptor.proto",
                 google::protobuf::DescriptorProto::descriptor()->file()->DebugString());
  CreateTempFile("foo.proto",
                 R"schema(
      syntax = "proto2";
      package proto2_unittest;
      import "google/protobuf/descriptor.proto";
      message A {
        optional B b = 1 [targets = TARGET_TYPE_ENUM];
      }
      message B {
        optional int32 i = 1 [targets = TARGET_TYPE_ONEOF];
      }
      extend google.protobuf.FileOptions {
        optional A file_options = 5000;
      }
      option (file_options).b.i = 42;
      )schema");

  Run("protocol_compiler --plug_out=$tmpdir --proto_path=$tmpdir foo.proto");
  // We have target constraint violations at two different edges in the file
  // options, so let's make sure both are caught.
  ExpectErrorSubstring(
      "Option proto2_unittest.A.b cannot be set on an entity of type `file`.");
  ExpectErrorSubstring(
      "Option proto2_unittest.B.i cannot be set on an entity of type `file`.");
}